

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coulombic_energy_compute.cpp
# Opt level: O0

void __thiscall
CoulombicEnergyCompute::particle_cluster_interact
          (CoulombicEnergyCompute *this,array<unsigned_long,_2UL> target_node_idxs,
          size_t source_node_idx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  reference pvVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  long in_RCX;
  long lVar18;
  long in_RDI;
  double dVar19;
  double dVar20;
  double dz;
  double dy;
  double dx;
  size_t kk;
  int k3;
  int k2;
  int k1;
  double pot_temp;
  double target_q;
  double target_z;
  double target_y;
  double target_x;
  size_t j;
  double *coul_eng_ptr;
  double *mol_clusters_q_ptr;
  double *mol_clusters_z_ptr;
  double *mol_clusters_y_ptr;
  double *mol_clusters_x_ptr;
  size_t source_cluster_interp_charges_begin;
  size_t source_cluster_interp_pts_begin;
  int num_mol_interp_charges_per_node;
  int num_mol_interp_pts_per_node;
  double *mol_q_ptr;
  double *mol_z_ptr;
  double *mol_y_ptr;
  double *mol_x_ptr;
  size_t target_node_end;
  size_t target_node_begin;
  size_type in_stack_fffffffffffffef8;
  array<unsigned_long,_2UL> *in_stack_ffffffffffffff00;
  int local_cc;
  int local_c8;
  int local_c4;
  double local_c0;
  ulong local_98;
  
  pvVar8 = std::array<unsigned_long,_2UL>::operator[]
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_98 = *pvVar8;
  pvVar8 = std::array<unsigned_long,_2UL>::operator[]
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  uVar7 = *pvVar8;
  pdVar9 = Particles::x_ptr((Particles *)0x11a76e);
  pdVar10 = Particles::y_ptr((Particles *)0x11a787);
  pdVar11 = Particles::z_ptr((Particles *)0x11a7a0);
  pdVar12 = Molecule::charge_ptr((Molecule *)0x11a7b9);
  iVar5 = *(int *)(in_RDI + 0x38);
  lVar18 = in_RCX * *(int *)(in_RDI + 0x38);
  iVar6 = *(int *)(in_RDI + 0x3c);
  pdVar13 = InterpolationPoints::interp_x_ptr((InterpolationPoints *)0x11a816);
  pdVar14 = InterpolationPoints::interp_y_ptr((InterpolationPoints *)0x11a82f);
  pdVar15 = InterpolationPoints::interp_z_ptr((InterpolationPoints *)0x11a848);
  pdVar16 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x11a85e);
  pdVar17 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x11a877);
  for (; local_98 < uVar7; local_98 = local_98 + 1) {
    dVar1 = pdVar9[local_98];
    dVar2 = pdVar10[local_98];
    dVar3 = pdVar11[local_98];
    dVar4 = pdVar12[local_98];
    local_c0 = 0.0;
    for (local_c4 = 0; local_c4 < iVar5; local_c4 = local_c4 + 1) {
      for (local_c8 = 0; local_c8 < iVar5; local_c8 = local_c8 + 1) {
        for (local_cc = 0; local_cc < iVar5; local_cc = local_cc + 1) {
          dVar19 = pdVar16[in_RCX * iVar6 + (long)(local_c4 * iVar5 * iVar5) +
                           (long)(local_c8 * iVar5) + (long)local_cc] / *(double *)(in_RDI + 0x30);
          dVar20 = sqrt((dVar3 - pdVar15[lVar18 + local_cc]) * (dVar3 - pdVar15[lVar18 + local_cc])
                        + (dVar1 - pdVar13[lVar18 + local_c4]) *
                          (dVar1 - pdVar13[lVar18 + local_c4]) +
                          (dVar2 - pdVar14[lVar18 + local_c8]) *
                          (dVar2 - pdVar14[lVar18 + local_c8]));
          local_c0 = dVar19 / dVar20 + local_c0;
        }
      }
    }
    *pdVar17 = dVar4 * local_c0 + *pdVar17;
  }
  return;
}

Assistant:

void CoulombicEnergyCompute::particle_cluster_interact(std::array<std::size_t, 2> target_node_idxs,
                                                       std::size_t source_node_idx)
{
//    timers_.particle_cluster_interact.start();
    
    /* Targets */
    
    std::size_t target_node_begin          = target_node_idxs[0];
    std::size_t target_node_end            = target_node_idxs[1];
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();

    const double* __restrict mol_q_ptr = molecule_.charge_ptr();

    /* Sources */
    
    int num_mol_interp_pts_per_node                 = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node             = num_mol_interp_charges_per_node_;

    std::size_t source_cluster_interp_pts_begin     = source_node_idx * num_mol_interp_pts_per_node_;
    std::size_t source_cluster_interp_charges_begin = source_node_idx * num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_clusters_x_ptr     = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr     = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr     = mol_interp_pts_.interp_z_ptr();
    
    const double* __restrict mol_clusters_q_ptr     = mol_interp_charge_.data();

    /* Potential */

    double* __restrict coul_eng_ptr = coul_eng_vec_.data();
    
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                                      mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                                      mol_clusters_q_ptr, coul_eng_ptr)
#endif
    for (std::size_t j = target_node_begin; j < target_node_end; ++j) {

        double target_x = mol_x_ptr[j];
        double target_y = mol_y_ptr[j];
        double target_z = mol_z_ptr[j];
        double target_q = mol_q_ptr[j];
        
        double pot_temp = 0.;
        
#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) reduction(+:pot_temp)
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
                
            std::size_t kk = source_cluster_interp_charges_begin
                           + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                           + k2 * num_mol_interp_pts_per_node + k3;

            double dx = target_x - mol_clusters_x_ptr[source_cluster_interp_pts_begin + k1];
            double dy = target_y - mol_clusters_y_ptr[source_cluster_interp_pts_begin + k2];
            double dz = target_z - mol_clusters_z_ptr[source_cluster_interp_pts_begin + k3];

            pot_temp += mol_clusters_q_ptr[kk] / eps_solute_ / std::sqrt(dx*dx + dy*dy + dz*dz);
        }
        }
        }
        
        pot_temp *= target_q;

#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif  OPENMP_ENABLED
        #pragma omp atomic update
#endif
        coul_eng_ptr[0] += pot_temp;
    }

//    timers_.particle_cluster_interact.stop();
}